

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shaderprogram.cpp
# Opt level: O3

void __thiscall FShaderProgram::Link(FShaderProgram *this,char *name)

{
  GLuint handle;
  GLint status;
  GLsizei length;
  FString local_30;
  GLint local_28 [2];
  
  handle = this->mProgram;
  FString::FString(&local_30,name);
  FGLDebug::LabelObject(0x82e2,handle,&local_30);
  FString::~FString(&local_30);
  (*_ptrc_glLinkProgram)(this->mProgram);
  local_28[0] = 0;
  (*_ptrc_glGetProgramiv)(this->mProgram,0x8b82,local_28);
  if (local_28[0] == 0) {
    local_28[1] = 0;
    GetProgramInfoLog::buffer[0] = '\0';
    (*_ptrc_glGetProgramInfoLog)(this->mProgram,10000,local_28 + 1,GetProgramInfoLog::buffer);
    FString::FString(&local_30,GetProgramInfoLog::buffer);
    I_FatalError("Link Shader \'%s\':\n%s\n",name,local_30.Chars);
    FString::~FString(&local_30);
  }
  return;
}

Assistant:

void FShaderProgram::Link(const char *name)
{
	FGLDebug::LabelObject(GL_PROGRAM, mProgram, name);
	glLinkProgram(mProgram);

	GLint status = 0;
	glGetProgramiv(mProgram, GL_LINK_STATUS, &status);
	if (status == GL_FALSE)
	{
		I_FatalError("Link Shader '%s':\n%s\n", name, GetProgramInfoLog(mProgram).GetChars());
	}
}